

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O1

uint lodepng_convert_rgb(uint *r_out,uint *g_out,uint *b_out,uint r_in,uint g_in,uint b_in,
                        LodePNGColorMode *mode_out,LodePNGColorMode *mode_in)

{
  uchar *puVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  
  if (LCT_RGBA < mode_in->colortype) {
switchD_0011eefa_caseD_1:
    return 0x1f;
  }
  bVar2 = 0x10 - (char)mode_out->bitdepth;
  iVar3 = (int)(0xffff / (ulong)(uint)~(-1 << ((byte)mode_in->bitdepth & 0x1f)));
  switch(mode_in->colortype) {
  default:
    uVar4 = iVar3 * r_in;
    uVar5 = uVar4;
    uVar7 = uVar4;
    break;
  case 1:
  case 5:
    goto switchD_0011eefa_caseD_1;
  case LCT_RGB:
  case LCT_RGBA:
    uVar4 = iVar3 * b_in;
    uVar5 = g_in * iVar3;
    uVar7 = r_in * iVar3;
    break;
  case LCT_PALETTE:
    if (mode_in->palettesize <= (ulong)r_in) {
      return 0x52;
    }
    puVar1 = mode_in->palette;
    uVar6 = (ulong)(r_in << 2);
    uVar7 = (uint)CONCAT11(puVar1[uVar6],puVar1[uVar6]);
    uVar5 = (uint)CONCAT11(puVar1[uVar6 + 1],puVar1[uVar6 + 1]);
    uVar4 = (uint)CONCAT11(puVar1[uVar6 + 2],puVar1[uVar6 + 2]);
  }
  uVar8 = 0x1f;
  switch(mode_out->colortype) {
  case LCT_GREY:
  case LCT_GREY_ALPHA:
    *r_out = uVar7 >> (bVar2 & 0x1f);
    break;
  case 1:
  case 5:
    goto switchD_0011eefa_caseD_1;
  case LCT_RGB:
  case LCT_RGBA:
    *r_out = uVar7 >> (bVar2 & 0x1f);
    *g_out = uVar5 >> (bVar2 & 0x1f);
    *b_out = uVar4 >> (bVar2 & 0x1f);
    break;
  case LCT_PALETTE:
    if (uVar7 >> 8 != (uVar7 & 0xff)) {
      return 0x52;
    }
    if (uVar5 >> 8 != (uVar5 & 0xff)) {
      return 0x52;
    }
    if (uVar4 >> 8 != (uVar4 & 0xff)) {
      return 0x52;
    }
    if (mode_out->palettesize == 0) {
      return 0x52;
    }
    puVar1 = mode_out->palette;
    uVar6 = 0;
    uVar8 = 2;
    while (((uVar7 >> 8 != (uint)puVar1[uVar8 - 2] || (uVar5 >> 8 != (uint)puVar1[uVar8 - 1])) ||
           (uVar4 >> 8 != (uint)puVar1[uVar8]))) {
      uVar6 = (ulong)((uint)uVar6 + 1);
      uVar8 = uVar8 + 4;
      if (mode_out->palettesize <= uVar6) {
        return 0x52;
      }
    }
    *r_out = (uint)uVar6;
    break;
  default:
    goto switchD_0011eefa_caseD_1;
  }
  uVar8 = 0;
switchD_0011eefa_caseD_1:
  return uVar8;
}

Assistant:

unsigned lodepng_convert_rgb(
    unsigned* r_out, unsigned* g_out, unsigned* b_out,
    unsigned r_in, unsigned g_in, unsigned b_in,
    const LodePNGColorMode* mode_out, const LodePNGColorMode* mode_in) {
  unsigned r = 0, g = 0, b = 0;
  unsigned mul = 65535 / ((1u << mode_in->bitdepth) - 1u); /*65535, 21845, 4369, 257, 1*/
  unsigned shift = 16 - mode_out->bitdepth;

  if(mode_in->colortype == LCT_GREY || mode_in->colortype == LCT_GREY_ALPHA) {
    r = g = b = r_in * mul;
  } else if(mode_in->colortype == LCT_RGB || mode_in->colortype == LCT_RGBA) {
    r = r_in * mul;
    g = g_in * mul;
    b = b_in * mul;
  } else if(mode_in->colortype == LCT_PALETTE) {
    if(r_in >= mode_in->palettesize) return 82;
    r = mode_in->palette[r_in * 4 + 0] * 257u;
    g = mode_in->palette[r_in * 4 + 1] * 257u;
    b = mode_in->palette[r_in * 4 + 2] * 257u;
  } else {
    return 31;
  }

  /* now convert to output format */
  if(mode_out->colortype == LCT_GREY || mode_out->colortype == LCT_GREY_ALPHA) {
    *r_out = r >> shift ;
  } else if(mode_out->colortype == LCT_RGB || mode_out->colortype == LCT_RGBA) {
    *r_out = r >> shift ;
    *g_out = g >> shift ;
    *b_out = b >> shift ;
  } else if(mode_out->colortype == LCT_PALETTE) {
    unsigned i;
    /* a 16-bit color cannot be in the palette */
    if((r >> 8) != (r & 255) || (g >> 8) != (g & 255) || (b >> 8) != (b & 255)) return 82;
    for(i = 0; i < mode_out->palettesize; i++) {
      unsigned j = i * 4;
      if((r >> 8) == mode_out->palette[j + 0] && (g >> 8) == mode_out->palette[j + 1] &&
          (b >> 8) == mode_out->palette[j + 2]) {
        *r_out = i;
        return 0;
      }
    }
    return 82;
  } else {
    return 31;
  }

  return 0;
}